

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O0

void __thiscall JitFFI::SysV64::ArgOPCounter::add(ArgOPCounter *this,OP type)

{
  OP type_local;
  ArgOPCounter *this_local;
  
  switch(type) {
  case op_void:
    this->int_count = this->int_count + 1;
    break;
  case op_int:
    this->int_count = this->int_count + 1;
    break;
  case op_float:
    this->float_count = this->float_count + 1;
    break;
  case op_memory:
    this->memory_count = this->memory_count + 1;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                  ,0x244,"void JitFFI::SysV64::ArgOPCounter::add(ArgTypeInfo::OP)");
  }
  return;
}

Assistant:

void add(ArgTypeInfo::OP type) {
				switch (type) {
				case ArgTypeInfo::op_void: int_count++; break;
				case ArgTypeInfo::op_int: int_count++; break;
				case ArgTypeInfo::op_float: float_count++; break;
				case ArgTypeInfo::op_memory: memory_count++; break;
				default: assert(false);
				}
			}